

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::requeueHttp2Requests(QHttpNetworkConnectionChannel *this)

{
  bool bVar1;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *pair;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_RDI;
  long in_FS_OFFSET;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *httpMessagePair;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> h2RequestsToSendCopy;
  const_iterator *in_stack_ffffffffffffffa8;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *__obj;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_stack_ffffffffffffffc0;
  QHttpNetworkConnectionPrivate *this_00;
  undefined1 local_18 [8];
  QObjectPrivate local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QObjectPrivate)0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  __obj = in_RDI + 0x10;
  memset(local_18,0,8);
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::QMultiMap
            ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2fcb67);
  std::
  exchange<QMultiMap<int,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>,QMultiMap<int,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>
            (__obj,in_RDI);
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::~QMultiMap
            ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2fcb85);
  this_00 = (QHttpNetworkConnectionPrivate *)&stack0xfffffffffffffff0;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
            (in_stack_ffffffffffffffc0);
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
            (in_stack_ffffffffffffffc0);
  while( true ) {
    bVar1 = ::operator!=((const_iterator *)in_RDI,in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    pair = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::
           operator*((const_iterator *)0x2fcc02);
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fcc18);
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fcc20);
    QHttpNetworkConnectionPrivate::requeueRequest(this_00,pair);
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::operator++
              ((const_iterator *)in_RDI);
  }
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::~QMultiMap
            ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2fcc43);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::requeueHttp2Requests()
{
    const auto h2RequestsToSendCopy = std::exchange(h2RequestsToSend, {});
    for (const auto &httpMessagePair : h2RequestsToSendCopy)
        connection->d_func()->requeueRequest(httpMessagePair);
}